

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::Marray<unsigned_char,std::allocator<unsigned_long>>::
Marray<unsigned_char,true,std::allocator<unsigned_long>>
          (Marray<unsigned_char,std::allocator<unsigned_long>> *this,
          View<unsigned_char,_true,_std::allocator<unsigned_long>_> *in)

{
  void *__dest;
  pointer __src;
  pointer puVar1;
  bool bVar2;
  pointer puVar3;
  size_t sVar4;
  size_t *psVar5;
  bool *pbVar6;
  uchar *puVar7;
  reference puVar8;
  ulong local_70;
  size_t j_1;
  const_iterator it;
  size_t j;
  allocator<unsigned_char> local_19;
  View<unsigned_char,_true,_std::allocator<unsigned_long>_> *local_18;
  View<unsigned_char,_true,_std::allocator<unsigned_long>_> *in_local;
  Marray<unsigned_char,_std::allocator<unsigned_long>_> *this_local;
  
  local_18 = in;
  in_local = (View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)this;
  std::allocator<unsigned_char>::allocator(&local_19);
  View<unsigned_char,_false,_std::allocator<unsigned_long>_>::View
            ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this,&local_19);
  std::allocator<unsigned_char>::~allocator(&local_19);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)(this + 0x40));
  View<unsigned_char,_true,_std::allocator<unsigned_long>_>::testInvariant(local_18);
  marray_detail::Geometry<std::allocator<unsigned_long>_>::operator=
            ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),&local_18->geometry_);
  it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    puVar1 = it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    puVar3 = (pointer)View<unsigned_char,_true,_std::allocator<unsigned_long>_>::dimension(local_18)
    ;
    if (puVar3 <= puVar1) break;
    sVar4 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides
                      (&local_18->geometry_,
                       (size_t)it.coordinates_.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
    psVar5 = marray_detail::Geometry<std::allocator<unsigned_long>_>::strides
                       ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),
                        (size_t)it.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
    *psVar5 = sVar4;
    it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)it.coordinates_.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 1);
  }
  pbVar6 = marray_detail::Geometry<std::allocator<unsigned_long>_>::isSimple
                     ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
  *pbVar6 = true;
  sVar4 = View<unsigned_char,_true,_std::allocator<unsigned_long>_>::size(local_18);
  if (sVar4 == 0) {
    *(undefined8 *)this = 0;
  }
  else {
    sVar4 = View<unsigned_char,_true,_std::allocator<unsigned_long>_>::size(local_18);
    puVar7 = __gnu_cxx::new_allocator<unsigned_char>::allocate
                       ((new_allocator<unsigned_char> *)(this + 0x40),sVar4,(void *)0x0);
    *(uchar **)this = puVar7;
  }
  bVar2 = View<unsigned_char,_true,_std::allocator<unsigned_long>_>::isSimple(local_18);
  if (bVar2) {
    __dest = *(void **)this;
    __src = local_18->data_;
    sVar4 = View<unsigned_char,_true,_std::allocator<unsigned_long>_>::size(local_18);
    memcpy(__dest,__src,sVar4);
  }
  else {
    View<unsigned_char,_true,_std::allocator<unsigned_long>_>::begin
              ((const_iterator *)&j_1,local_18);
    local_70 = 0;
    while( true ) {
      sVar4 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::size
                        ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this);
      if (sVar4 <= local_70) break;
      puVar8 = Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_>::operator*
                         ((Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_> *)&j_1);
      *(uchar *)(*(long *)this + local_70) = *puVar8;
      local_70 = local_70 + 1;
      Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_>::operator++
                ((Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_> *)&j_1);
    }
    Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_>::~Iterator
              ((Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_> *)&j_1);
  }
  Marray<unsigned_char,_std::allocator<unsigned_long>_>::testInvariant
            ((Marray<unsigned_char,_std::allocator<unsigned_long>_> *)this);
  return;
}

Assistant:

inline
Marray<T, A>::Marray
(
    const View<TLocal, isConstLocal, ALocal>& in
) 
: dataAllocator_()
{
    if(!MARRAY_NO_ARG_TEST) {
        in.testInvariant();
    }

    // adapt geometry
    this->geometry_ = in.geometry_;
    for(std::size_t j=0; j<in.dimension(); ++j) {
        this->geometry_.strides(j) = in.geometry_.shapeStrides(j); // !
    }
    this->geometry_.isSimple() = true;

    // copy data
    if(in.size() == 0) {
        this->data_ = 0;
    }
    else {
        this->data_ = dataAllocator_.allocate(in.size());
    }
    if(in.isSimple() && marray_detail::IsEqual<T, TLocal>::type) {
        memcpy(this->data_, in.data_, (in.size())*sizeof(T));
    }
    else {
        typename View<TLocal, isConstLocal, ALocal>::const_iterator it = in.begin();
        for(std::size_t j=0; j<this->size(); ++j, ++it)  {
            this->data_[j] = static_cast<T>(*it);
        }
    }

    testInvariant();
}